

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall HighsSparseMatrix::scaleRow(HighsSparseMatrix *this,HighsInt row,double rowScale)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  int in_ESI;
  HighsSparseMatrix *in_RDI;
  double in_XMM0_Qa;
  HighsInt iEl_1;
  HighsInt iEl;
  HighsInt iCol;
  int local_24;
  int local_20;
  int local_1c;
  
  bVar1 = isColwise(in_RDI);
  if (bVar1) {
    for (local_1c = 0; local_1c < in_RDI->num_col_; local_1c = local_1c + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_1c);
      for (local_20 = *pvVar2;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_1c + 1)), local_20 < *pvVar2;
          local_20 = local_20 + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_20);
        if (*pvVar2 == in_ESI) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->value_,(long)local_20);
          *pvVar3 = in_XMM0_Qa * *pvVar3;
        }
      }
    }
  }
  else {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)in_ESI);
    for (local_24 = *pvVar2;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->start_,(long)(in_ESI + 1)), local_24 < *pvVar2;
        local_24 = local_24 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->value_,(long)local_24);
      *pvVar3 = in_XMM0_Qa * *pvVar3;
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::scaleRow(const HighsInt row, const double rowScale) {
  assert(this->formatOk());
  assert(row >= 0);
  assert(row < this->num_row_);
  assert(rowScale);

  if (this->isColwise()) {
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++) {
        if (this->index_[iEl] == row) this->value_[iEl] *= rowScale;
      }
    }
  } else {
    for (HighsInt iEl = this->start_[row]; iEl < this->start_[row + 1]; iEl++)
      this->value_[iEl] *= rowScale;
  }
}